

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

SAM_hdr_tag * sam_hdr_find_key(SAM_hdr *sh,SAM_hdr_type *type,char *key,SAM_hdr_tag **prev)

{
  SAM_hdr_tag *pSVar1;
  SAM_hdr_tag *pSVar2;
  SAM_hdr_tag *pSVar3;
  
  pSVar2 = (SAM_hdr_tag *)&type->tag;
  pSVar1 = (SAM_hdr_tag *)0x0;
  do {
    pSVar3 = pSVar1;
    pSVar2 = pSVar2->next;
    if (pSVar2 == (SAM_hdr_tag *)0x0) break;
    pSVar1 = pSVar2;
  } while ((*pSVar2->str != *key) || (pSVar2->str[1] != key[1]));
  if (prev != (SAM_hdr_tag **)0x0) {
    *prev = pSVar3;
  }
  return pSVar2;
}

Assistant:

SAM_hdr_tag *sam_hdr_find_key(SAM_hdr *sh,
			      SAM_hdr_type *type,
			      char *key,
			      SAM_hdr_tag **prev) {
    SAM_hdr_tag *tag, *p = NULL;

    for (tag = type->tag; tag; p = tag, tag = tag->next) {
	if (tag->str[0] == key[0] && tag->str[1] == key[1]) {
	    if (prev)
		*prev = p;
	    return tag;
	}
    }

    if (prev)
	*prev = p;

    return NULL;
}